

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O2

bool __thiscall ON_Ellipse::Create(ON_Ellipse *this,ON_Circle *c)

{
  bool bVar1;
  ON_Plane *pOVar2;
  long lVar3;
  ON_Ellipse *pOVar4;
  byte bVar5;
  double dVar6;
  double dVar7;
  
  bVar5 = 0;
  pOVar2 = ON_Circle::Plane(c);
  dVar6 = ON_Circle::Radius(c);
  dVar7 = ON_Circle::Radius(c);
  pOVar4 = this;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar4->plane).origin.x = (pOVar2->origin).x;
    pOVar2 = (ON_Plane *)((long)pOVar2 + (ulong)bVar5 * -0x10 + 8);
    pOVar4 = (ON_Ellipse *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  this->radius[0] = dVar6;
  this->radius[1] = dVar7;
  bVar1 = IsValid(this);
  return bVar1;
}

Assistant:

bool ON_Ellipse::Create( const ON_Circle& c )
{
  return Create( c.Plane(), c.Radius(), c.Radius() );
}